

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncWorker.hpp
# Opt level: O0

void __thiscall sftm::CAsyncWorker::ThreadFunc(CAsyncWorker *this)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  CAsyncTask *pTask;
  CAsyncWorker *this_local;
  
  while (((this->m_bStopping ^ 0xffU) & 1) != 0) {
    lock._8_8_ = CConcurrentPtrQueue<sftm::CAsyncTask>::Pop((this->m_ownerData).m_pTaskQueue);
    if ((CAsyncTask *)lock._8_8_ != (CAsyncTask *)0x0) {
      (*((CAsyncTask *)lock._8_8_)->_vptr_CAsyncTask[2])();
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_28,(this->m_ownerData).m_pMutWorkerIdle);
    std::condition_variable::wait((unique_lock *)(this->m_ownerData).m_pCvWorkerIdle);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  }
  this->m_bFinished = true;
  return;
}

Assistant:

void ThreadFunc() noexcept
		{
			while (!m_bStopping)
			{
				CAsyncTask* pTask = m_ownerData.m_pTaskQueue->Pop();
				if (pTask)
					pTask->Execute();

				std::unique_lock<std::mutex> lock(*m_ownerData.m_pMutWorkerIdle);
				m_ownerData.m_pCvWorkerIdle->wait(lock);
			}

			m_bFinished = true;
		}